

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

string * __thiscall
helics::CommonCore::getInjectionUnits_abi_cxx11_(CommonCore *this,InterfaceHandle handle)

{
  char cVar1;
  pair<helics::route_id,_helics::ActionMessage> *ppVar2;
  FederateState *pFVar3;
  InputInfo *this_00;
  string *psVar4;
  
  ppVar2 = getHandleInfo(this,handle);
  psVar4 = (string *)&gEmptyString_abi_cxx11_;
  if (ppVar2 != (pair<helics::route_id,_helics::ActionMessage> *)0x0) {
    cVar1 = (char)(ppVar2->second).messageID;
    if (cVar1 == 'p') {
      psVar4 = (string *)((ppVar2->second).payload.buffer._M_elems + 8);
    }
    else if (cVar1 == 'i') {
      pFVar3 = getFederateAt(this,(LocalFederateId)(ppVar2->second).messageAction);
      this_00 = InterfaceInfo::getInput(&pFVar3->interfaceInformation,handle);
      if (this_00 != (InputInfo *)0x0) {
        psVar4 = InputInfo::getInjectionUnits_abi_cxx11_(this_00);
        return psVar4;
      }
    }
  }
  return psVar4;
}

Assistant:

const std::string& CommonCore::getInjectionUnits(InterfaceHandle handle) const
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo != nullptr) {
        switch (handleInfo->handleType) {
            case InterfaceType::INPUT: {
                auto* fed = getFederateAt(handleInfo->local_fed_id);
                auto* inpInfo = fed->interfaces().getInput(handle);
                if (inpInfo != nullptr) {
                    return inpInfo->getInjectionUnits();
                }
                break;
            }
            case InterfaceType::PUBLICATION:
                return handleInfo->units;
            default:
                return gEmptyString;
        }
    }
    return gEmptyString;
}